

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O3

int main(void)

{
  Am_Slot_Key AVar1;
  Am_Input_Char AVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  Am_Wrapper *pAVar7;
  undefined8 uVar8;
  Am_Value_List *pAVar9;
  Am_Object *pAVar10;
  Am_Constraint *pAVar11;
  ulong uVar12;
  Am_Object AVar13;
  ostream *poVar14;
  long *plVar15;
  Am_Object AVar16;
  ushort uVar17;
  long lVar18;
  Am_Value local_138;
  Am_Object local_128;
  Am_Object cmd2;
  Am_Object cmd;
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object interpolator;
  Am_Value_List line_rects;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Object local_b0;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Style thickblack;
  Am_Style thickred;
  Am_Object local_50;
  Am_Image_Array local_48 [8];
  Am_Image_Array local_40 [8];
  Am_Value_List color_rects;
  
  Am_Initialize();
  uVar3 = Am_Register_Slot_Name("MOVER");
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_138);
  make_color_rect((Am_Style *)&line_rects);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_((Am_Object *)&line_rects);
  uVar8 = Am_Value_List::Add(&local_138,pAVar7,1,1);
  make_color_rect((Am_Style *)&cmd);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&cmd);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  make_color_rect((Am_Style *)&cmd2);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&cmd2);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  make_color_rect((Am_Style *)&local_128);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_128);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  make_color_rect((Am_Style *)&local_108);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_108);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  make_color_rect((Am_Style *)&local_f8);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_f8);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  make_color_rect((Am_Style *)&local_e8);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_e8);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  make_color_rect((Am_Style *)&local_100);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(&local_100);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar8,pAVar7,1,1);
  Am_Value_List::Am_Value_List(&color_rects,pAVar9);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_e8);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd);
  Am_Object::~Am_Object((Am_Object *)&line_rects);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_138);
  Am_Image_Array::Am_Image_Array(local_40,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x3f800000,0,0,&thickred,7,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,
                     local_40);
  Am_Image_Array::~Am_Image_Array(local_40);
  Am_Image_Array::Am_Image_Array(local_48,(Am_Image_Array *)&Am_No_Image);
  Am_Style::Am_Style((Am_Style *)0x0,0,0,&thickblack,7,1,0,0,&Am_DEFAULT_DASH_LIST,2,0,0,local_48);
  Am_Image_Array::~Am_Image_Array(local_48);
  Am_Value_List::Am_Value_List((Am_Value_List *)&local_138);
  Am_Object::Create((char *)&cmd);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar4 = Am_Object::Set((ushort)&cmd,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar10);
  uVar8 = Am_Value_List::Add(&local_138,pAVar7,1,1);
  Am_Object::Create((char *)&cmd2);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar4 = Am_Object::Set((ushort)&cmd2,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar10);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  Am_Object::Create((char *)&local_128);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar4 = Am_Object::Set((ushort)&local_128,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_(&thickred);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar10);
  uVar8 = Am_Value_List::Add(uVar8,pAVar7,1,1);
  Am_Object::Create((char *)&local_108);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar4 = Am_Object::Set((ushort)&local_108,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_(&thickblack);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  pAVar7 = Am_Object::operator_cast_to_Am_Wrapper_(pAVar10);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar8,pAVar7,1,1);
  Am_Value_List::Am_Value_List(&line_rects,pAVar9);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&local_138);
  Am_Value_List::Start();
  Am_Value_List::Start();
  Am_Object::Create((char *)&local_138);
  uVar17 = (ushort)&local_138;
  uVar4 = Am_Object::Set(uVar17,100,10);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Bottom_Is_Bottom_Of_Owner)
  ;
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x94,(ulong)pAVar11);
  uVar4 = Am_Object::Set(uVar4,true,1);
  pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&color_rects);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xa2,(ulong)pAVar7);
  uVar12 = Am_Value_List::Get();
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Value *)0x169,uVar12);
  Am_Object::operator=(&palette,pAVar10);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Create((char *)&local_138);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Right_Is_Right_Of_Owner);
  uVar4 = Am_Object::Set(uVar17,(Am_Constraint *)0x64,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Bottom_Is_Bottom_Of_Owner)
  ;
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Horizontal_Layout);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x94,(ulong)pAVar11);
  uVar4 = Am_Object::Set(uVar4,true,1);
  pAVar7 = Am_Value_List::operator_cast_to_Am_Wrapper_(&line_rects);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0xa2,(ulong)pAVar7);
  uVar12 = Am_Value_List::Get();
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Value *)0x169,uVar12);
  Am_Object::operator=(&line_palette,pAVar10);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Create((char *)&local_138);
  uVar4 = Am_Object::Set(uVar17,0xa0,10);
  uVar4 = Am_Object::Set(uVar4,0xa1,10);
  uVar4 = Am_Object::Set(uVar4,100,0);
  uVar4 = Am_Object::Set(uVar4,0x65,0x28);
  uVar4 = Am_Object::Set(uVar4,0x66,0x280);
  uVar4 = Am_Object::Set(uVar4,0x67,0x1b8);
  Am_Object::Create((char *)&cmd);
  uVar5 = Am_Object::Set((ushort)&cmd,100,0x78);
  uVar5 = Am_Object::Set(uVar5,0x65,0x78);
  uVar5 = Am_Object::Set(uVar5,0x66,0x32);
  uVar5 = Am_Object::Set(uVar5,0x67,0x32);
  uVar12 = Am_Formula::Multi_Constraint(true);
  uVar5 = Am_Object::Set(uVar5,(Am_Constraint *)0x6a,uVar12);
  Am_Object::Create((char *)&cmd2);
  Am_Time::Am_Time((Am_Time *)&local_128,2000);
  pAVar7 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_128);
  pAVar10 = (Am_Object *)Am_Object::Set((ushort)&cmd2,(Am_Wrapper *)0xfd,(ulong)pAVar7);
  pAVar10 = (Am_Object *)Am_Object::operator=(&coloranimation,pAVar10);
  uVar12 = Am_Animate_With(pAVar10);
  uVar5 = Am_Object::Set(uVar5,(Am_Constraint *)0x6a,uVar12);
  uVar12 = Am_Formula::Multi_Constraint(true);
  uVar5 = Am_Object::Set(uVar5,(Am_Constraint *)0x6b,uVar12);
  Am_Object::Create((char *)&local_108);
  Am_Time::Am_Time((Am_Time *)&local_f8,3000);
  pAVar7 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_f8);
  pAVar10 = (Am_Object *)Am_Object::Set((ushort)&local_108,(Am_Wrapper *)0xfd,(ulong)pAVar7);
  uVar12 = Am_Animate_With(pAVar10);
  uVar5 = Am_Object::Set(uVar5,(Am_Constraint *)0x6b,uVar12);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar5 = Am_Object::Set(uVar5,(Am_Wrapper *)0x6b,(ulong)pAVar7);
  Am_Object::Create((char *)&local_e8);
  uVar6 = Am_Object::Set((ushort)&local_e8,100,0);
  uVar6 = Am_Object::Set(uVar6,0x65,0);
  uVar6 = Am_Object::Set(uVar6,0x66,1);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar6,0x67,1);
  pAVar10 = (Am_Object *)Am_Object::operator=(&rectvisibleanimation,pAVar10);
  uVar12 = Am_Animate_With(pAVar10);
  AVar13.data = (Am_Object_Data *)Am_Object::Set(uVar5,(Am_Constraint *)0x69,uVar12);
  Am_Object::Create((char *)&local_78);
  pAVar10 = (Am_Object *)Am_Object::Add_Part(AVar13,SUB81(&local_78,0),1);
  pAVar10 = (Am_Object *)Am_Object::operator=(&Mover,pAVar10);
  Am_Object::Am_Object(&local_70,pAVar10);
  AVar13.data._2_6_ = 0;
  AVar13.data._0_2_ = uVar3;
  AVar13.data = (Am_Object_Data *)Am_Object::Add_Part(uVar4,AVar13,(ulong)&local_70);
  Am_Object::Create((char *)&local_f0);
  uVar12 = Am_Object::Set((ushort)&local_f0,(char *)0xb9,0x10b451);
  Am_Object::Get_Object((ushort)&local_100,uVar12);
  uVar12 = Am_Object::Set((ushort)&local_100,(Am_Method_Wrapper *)0xca,(ulong)key_press.from_wrapper
                         );
  Am_Object::Get_Object((ushort)&local_80,uVar12);
  pAVar10 = (Am_Object *)Am_Object::Add_Part(AVar13,SUB81(&local_80,0),1);
  pAVar10 = (Am_Object *)Am_Object::operator=(&window,pAVar10);
  Am_Object::Am_Object(&local_68,pAVar10);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_68,0),1);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_78);
  Am_Object::~Am_Object(&local_e8);
  Am_Time::~Am_Time((Am_Time *)&local_f8);
  Am_Object::~Am_Object(&local_108);
  Am_Time::~Am_Time((Am_Time *)&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Create((char *)&cmd);
  Am_From_Sibling(uVar17,uVar3);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_138);
  uVar4 = Am_Object::Set((ushort)&cmd,(Am_Constraint *)0x64,(ulong)pAVar11);
  Am_Object::Create((char *)&cmd2);
  Am_Time::Am_Time((Am_Time *)&local_128,1000);
  pAVar7 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_128);
  uVar5 = Am_Object::Set((ushort)&cmd2,(Am_Wrapper *)0xe9,(ulong)pAVar7);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar5,0x183,0x14);
  uVar12 = Am_Animate_With(pAVar10);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x64,uVar12);
  uVar4 = Am_Object::Set(uVar4,0x65,0x14);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  Am_Object::operator=(&hopper,pAVar10);
  Am_Time::~Am_Time((Am_Time *)&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Formula::~Am_Formula((Am_Formula *)&local_138);
  Am_Object::~Am_Object(&cmd);
  Am_Object::Am_Object(&local_88,&hopper);
  Am_Object::Add_Part((Am_Object)0x10f4e0,SUB81(&local_88,0),1);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Create((char *)&cmd);
  uVar4 = Am_Object::Set((ushort)&cmd,0x66,0x14);
  uVar4 = Am_Object::Set(uVar4,0x67,0x14);
  Am_From_Sibling(uVar17,uVar3);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_138);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,(ulong)pAVar11);
  Am_Object::Create((char *)&cmd2);
  Am_Time::Am_Time((Am_Time *)&local_128,4000);
  pAVar7 = Am_Time::operator_cast_to_Am_Wrapper_((Am_Time *)&local_128);
  pAVar10 = (Am_Object *)Am_Object::Set((ushort)&cmd2,(Am_Wrapper *)0xfd,(ulong)pAVar7);
  uVar12 = Am_Animate_With(pAVar10);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,uVar12);
  uVar4 = Am_Object::Set(uVar4,100,10);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  Am_Object::operator=(&fixed_time,pAVar10);
  Am_Time::~Am_Time((Am_Time *)&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Formula::~Am_Formula((Am_Formula *)&local_138);
  Am_Object::~Am_Object(&cmd);
  Am_Object::Am_Object(&local_90,&fixed_time);
  Am_Object::Add_Part((Am_Object)0x10f4e0,SUB81(&local_90,0),1);
  Am_Object::~Am_Object(&local_90);
  Am_Object::Create((char *)&cmd);
  uVar4 = Am_Object::Set((ushort)&cmd,0x66,0x14);
  uVar4 = Am_Object::Set(uVar4,0x67,0x14);
  Am_From_Sibling(uVar17,uVar3);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_138);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,(ulong)pAVar11);
  Am_Object::Create((char *)&cmd2);
  pAVar10 = (Am_Object *)Am_Object::Set((ushort)&cmd2,0x10f,4);
  uVar12 = Am_Animate_With(pAVar10);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,uVar12);
  uVar4 = Am_Object::Set(uVar4,100,0x3c);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar4 = Am_Object::Set(uVar4,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  Am_Object::Create((char *)&local_128);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar5 = Am_Object::Set((ushort)&local_128,(Am_Wrapper *)0x181,(ulong)pAVar7);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar5 = Am_Object::Set(uVar5,(Am_Wrapper *)0x182,(ulong)pAVar7);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar5,true,0);
  pAVar10 = (Am_Object *)Am_Object::operator=(&wiggler_blink,pAVar10);
  uVar12 = Am_Animate_With(pAVar10);
  uVar4 = Am_Object::Set(uVar4,(Am_Constraint *)0x6a,uVar12);
  Am_Object::Create((char *)&local_108);
  pAVar10 = (Am_Object *)Am_Object::Set((ushort)&local_108,true,0);
  pAVar10 = (Am_Object *)Am_Object::operator=(&wiggler_vis_blink,pAVar10);
  uVar12 = Am_Animate_With(pAVar10);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,(Am_Constraint *)0x69,uVar12);
  Am_Object::operator=(&wiggler,pAVar10);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Formula::~Am_Formula((Am_Formula *)&local_138);
  Am_Object::~Am_Object(&cmd);
  Am_Object::Am_Object(&local_98,&wiggler);
  Am_Object::Add_Part((Am_Object)0x10f4e0,SUB81(&local_98,0),1);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Create((char *)&local_138);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar17,true,0);
  Am_Object::Am_Object(&interpolator,pAVar10);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Create((char *)&cmd2);
  Am_From_Sibling(uVar17,uVar3);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_138);
  uVar4 = Am_Object::Set((ushort)&cmd2,(Am_Constraint *)0x64,(ulong)pAVar11);
  Am_From_Sibling((ushort)&cmd,uVar3);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&cmd);
  uVar3 = Am_Object::Set(uVar4,(Am_Constraint *)0x65,(ulong)pAVar11);
  uVar12 = Am_Animate_With(&interpolator);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,uVar12);
  uVar12 = Am_Animate_With(&interpolator);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,uVar12);
  uVar3 = Am_Object::Set(uVar3,0x66,0x32);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar3,0x67,0x32);
  Am_Object::operator=(&Animator,pAVar10);
  Am_Formula::~Am_Formula((Am_Formula *)&cmd);
  Am_Formula::~Am_Formula((Am_Formula *)&local_138);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::Am_Object(&local_a0,&Animator);
  Am_Object::Add_Part((Am_Object)0x10f4e0,SUB81(&local_a0,0),1);
  Am_Object::~Am_Object(&local_a0);
  Am_Object::Am_Object(&local_a8,&Mover);
  Am_To_Top((Am_Object_Data *)&local_a8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::Create((char *)&cmd2);
  Am_From_Owner(uVar17);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_138);
  uVar3 = Am_Object::Set((ushort)&cmd2,(Am_Constraint *)0x66,(ulong)pAVar11);
  Am_From_Owner((ushort)&cmd);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&cmd);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x67,(ulong)pAVar11);
  uVar3 = Am_Object::Set(uVar3,0x169,0);
  Am_Object::Create((char *)&local_128);
  pAVar10 = (Am_Object *)Am_Object::Set((ushort)&local_128,true,1);
  uVar12 = Am_Animate_With(pAVar10);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar3,(Am_Constraint *)0x69,uVar12);
  Am_Object::operator=(&fade_group,pAVar10);
  Am_Object::~Am_Object(&local_128);
  Am_Formula::~Am_Formula((Am_Formula *)&cmd);
  Am_Formula::~Am_Formula((Am_Formula *)&local_138);
  Am_Object::~Am_Object(&cmd2);
  Am_Point_List::Translate(0x10f5b8,0x1db,true);
  Am_Point_List::Translate(0x10f5a8,0x1db,true);
  Am_Object::Create((char *)&local_138);
  pAVar7 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar3 = Am_Object::Set(uVar17,(Am_Wrapper *)0x6a,(ulong)pAVar7);
  pAVar7 = Am_Point_List::operator_cast_to_Am_Wrapper_((Am_Point_List *)triangle_point_list);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar3,(Am_Wrapper *)0xb2,(ulong)pAVar7);
  Am_Object::operator=(&polygon,pAVar10);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Am_Object(&local_b0,&palette);
  AVar13.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10f4e8,SUB81(&local_b0,0),1);
  Am_Object::Am_Object(&local_b8,&line_palette);
  AVar13.data = (Am_Object_Data *)Am_Object::Add_Part(AVar13,SUB81(&local_b8,0),1);
  Am_Object::Am_Object(&local_c0,&polygon);
  Am_Object::Add_Part(AVar13,SUB81(&local_c0,0),1);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_b8);
  Am_Object::~Am_Object(&local_b0);
  Am_Object::Create((char *)&local_138);
  uVar12 = Am_Animate_With((Am_Object *)&local_138);
  Am_Object::Set(0xf500,(Am_Constraint *)0xb2,uVar12);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Am_Object(&local_c8,&fade_group);
  Am_Object::Add_Part((Am_Object)0x10f4e0,SUB81(&local_c8,0),1);
  Am_Object::~Am_Object(&local_c8);
  get_icon((char *)&local_138,"images/horse.gif");
  Am_Object::operator=(&horse,(Am_Object *)&local_138);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  get_icon((char *)&local_138,"images/girl.gif");
  Am_Object::operator=(&girl,(Am_Object *)&local_138);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  get_icon((char *)&local_138,"images/dog.gif");
  Am_Object::operator=(&dog,(Am_Object *)&local_138);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  get_icon((char *)&local_138,"images/bugsmall.gif");
  Am_Object::operator=(&bug,(Am_Object *)&local_138);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  uVar3 = Am_Object::Set(0xf5d8,100,500);
  AVar13.data = (Am_Object_Data *)Am_Object::Set(uVar3,0x65,0x32);
  Am_Object::Create((char *)&local_138);
  Am_Object::Add_Part(AVar13,SUB81(&local_138,0),1);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  Am_Object::Create((char *)&cmd);
  uVar3 = Am_Object::Set((ushort)&cmd,true,0);
  uVar3 = Am_Object::Set(uVar3,(Am_Method_Wrapper *)0x102,_Am_Slow_In_Slow_Out);
  uVar3 = Am_Object::Add(uVar3,0x105,3);
  pAVar10 = (Am_Object *)Am_Object::Add(uVar3,0x106,3);
  Am_Object::operator=(&doganimation,pAVar10);
  Am_Object::~Am_Object(&cmd);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)same_as_horse_bottom);
  uVar3 = Am_Object::Set(0xf5e8,(Am_Constraint *)0x65,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)behind_horse);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,(ulong)pAVar11);
  uVar12 = Am_Animate_With(&doganimation);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x64,uVar12);
  uVar12 = Am_Animate_With(&doganimation);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,uVar12);
  Am_Object::Create((char *)&cmd);
  uVar4 = Am_Object::Set((ushort)&cmd,100,0xfffffc18);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar4,0x65,0xfffffc18);
  pAVar10 = (Am_Object *)Am_Object::operator=(&dogvisibleanimation,pAVar10);
  uVar12 = Am_Animate_With(pAVar10);
  Am_Object::Set(uVar3,(Am_Constraint *)0x69,uVar12);
  Am_Object::~Am_Object(&cmd);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_on_horse);
  uVar3 = Am_Object::Set(0xf5e0,(Am_Constraint *)0x64,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)top_on_horse);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar11);
  Am_Object::Set(uVar3,true,0);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)left_on_dog);
  uVar3 = Am_Object::Set(0xf5f0,(Am_Constraint *)0x64,(ulong)pAVar11);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)top_on_dog);
  uVar3 = Am_Object::Set(uVar3,(Am_Constraint *)0x65,(ulong)pAVar11);
  Am_Object::Set(uVar3,true,0);
  Am_Object::Am_Object(&cmd,&horse);
  AVar13.data = (Am_Object_Data *)Am_Object::Add_Part((Am_Object)0x10f4e8,SUB81(&cmd,0),1);
  Am_Object::Am_Object(&cmd2,&girl);
  AVar13.data = (Am_Object_Data *)Am_Object::Add_Part(AVar13,SUB81(&cmd2,0),1);
  Am_Object::Am_Object(&local_128,&dog);
  AVar13.data = (Am_Object_Data *)Am_Object::Add_Part(AVar13,SUB81(&local_128,0),1);
  Am_Object::Am_Object(&local_108,&bug);
  Am_Object::Add_Part(AVar13,SUB81(&local_108,0),1);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_128);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd);
  create_hacked_option_button();
  lVar18 = 0;
  do {
    read_pixmap((char *)&local_138);
    pAVar7 = Am_Image_Array::operator_cast_to_Am_Wrapper_((Am_Image_Array *)&local_138);
    Am_Value_List::Add(eye_walking_right,pAVar7,1,1);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_138);
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x30);
  lVar18 = 0;
  do {
    read_pixmap((char *)&local_138);
    pAVar7 = Am_Image_Array::operator_cast_to_Am_Wrapper_((Am_Image_Array *)&local_138);
    Am_Value_List::Add(eye_walking_left,pAVar7,1,1);
    Am_Image_Array::~Am_Image_Array((Am_Image_Array *)&local_138);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"creating eye icon \n",0x13);
  std::ostream::flush();
  cmd.data = (Am_Object_Data *)0x0;
  cmd2.data = (Am_Object_Data *)0x0;
  Am_Object::Create((char *)&local_128);
  uVar3 = Am_Object::Set((ushort)&local_128,100,5);
  uVar3 = Am_Object::Set(uVar3,0x65,0xdc);
  AVar1 = WALKER;
  Am_Object::Create((char *)&local_f8);
  uVar4 = Am_Object::Set((ushort)&local_f8,-100.0,0xcd);
  uVar4 = Am_Object::Set(uVar4,true,1);
  Am_Object::Create((char *)&local_100);
  uVar5 = Am_Object::Set((ushort)&local_100,0x11d,4);
  uVar5 = Am_Object::Set(uVar5,0x11e,0);
  local_138.value.long_value._4_4_ = 0;
  local_138.value.float_value = (float)Am_ANIMATION_BOUNCE.value;
  local_138.type = (Am_Value_Type)Am_Animation_End_Action::Am_Animation_End_Action_ID;
  pAVar10 = (Am_Object *)Am_Object::Set(uVar5,(Am_Value *)0xf0,(ulong)&local_138);
  pAVar10 = (Am_Object *)Am_Object::operator=(&cmd,pAVar10);
  Am_Object::Am_Object(&local_e8,pAVar10);
  pAVar10 = (Am_Object *)Am_Object::Set_Part(uVar4,(Am_Object)0xc5,(ulong)&local_e8);
  pAVar10 = (Am_Object *)Am_Object::operator=(&anim7,pAVar10);
  Am_Object::Am_Object(&local_108,pAVar10);
  AVar16.data._2_6_ = 0;
  AVar16.data._0_2_ = AVar1;
  uVar3 = Am_Object::Add_Part(uVar3,AVar16,(ulong)&local_108);
  uVar3 = Am_Object::Set(uVar3,0xb0,0);
  Am_Object::Create((char *)&local_f0);
  pAVar11 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)which_way);
  uVar4 = Am_Object::Set((ushort)&local_f0,(Am_Constraint *)0x114,(ulong)pAVar11);
  Am_Object::Create((char *)&local_50);
  pAVar10 = (Am_Object *)Am_Object::Set_Part(uVar4,(Am_Object)0xc5,(ulong)&local_50);
  pAVar10 = (Am_Object *)Am_Object::operator=(&change_pic_anim,pAVar10);
  uVar12 = Am_Animate_With(pAVar10);
  pAVar10 = (Am_Object *)Am_Object::Set(uVar3,(Am_Constraint *)0xb0,uVar12);
  Am_Object::operator=(&eye_icon,pAVar10);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_e8);
  Am_Value::~Am_Value(&local_138);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_128);
  poVar14 = (ostream *)operator<<((ostream *)&std::cout,&eye_icon);
  std::__ostream_insert<char,std::char_traits<char>>(poVar14," being added to ",0x10);
  plVar15 = (long *)operator<<(poVar14,&window);
  std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
  std::ostream::put((char)plVar15);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Am_Object((Am_Object *)&local_138,&eye_icon);
  Am_Object::Add_Part((Am_Object)0x10f4e0,SUB81(&local_138,0),1);
  Am_Object::~Am_Object((Am_Object *)&local_138);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done",4);
  plVar15 = (long *)operator<<((ostream *)&std::cout,&window);
  std::ios::widen((char)*(undefined8 *)(*plVar15 + -0x18) + (char)plVar15);
  std::ostream::put((char)plVar15);
  std::ostream::flush();
  std::ostream::flush();
  Am_Object::Am_Object(&local_128,&anim7);
  Am_Object::Am_Object(&local_f8,(Am_Object *)&Am_No_Object);
  AVar2 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_100,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_128,(Am_Object_Data *)&local_f8,AVar2,
                      (Am_Object_Data *)&local_100,0,0,true);
  Am_Object::~Am_Object(&local_100);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::~Am_Object(&local_128);
  Am_Object::Am_Object(&local_f0,&change_pic_anim);
  Am_Start_Animator((Am_Object_Data *)&local_f0,(Am_Value *)&Am_No_Value,(Am_Value *)&Am_No_Value);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&cmd2);
  Am_Object::~Am_Object(&cmd);
  Am_Main_Event_Loop();
  Am_Cleanup();
  Am_Object::~Am_Object(&interpolator);
  Am_Value_List::~Am_Value_List(&line_rects);
  Am_Style::~Am_Style(&thickblack);
  Am_Style::~Am_Style(&thickred);
  Am_Value_List::~Am_Value_List(&color_rects);
  return 0;
}

Assistant:

int
main()
{
  Am_Initialize();

  Am_Slot_Key MOVER = Am_Register_Slot_Name("MOVER");
  //  Am_Slot_Key COLOR = Am_Register_Slot_Name ("COLOR");

  //   Am_Object feedback = Am_Rectangle.Create ("Feedback")
  //     .Set (Am_FILL_STYLE, Am_No_Style)
  //     .Set (Am_LINE_STYLE, Am_Dotted_Line)
  //     .Set (Am_WIDTH, 50)
  //     .Set (Am_HEIGHT, 50)
  //     .Set (Am_VISIBLE, false)
  //   ;

  Am_Value_List color_rects = Am_Value_List()
                                  .Add(make_color_rect(Am_Red))
                                  .Add(make_color_rect(Am_Blue))
                                  .Add(make_color_rect(Am_Green))
                                  .Add(make_color_rect(Am_Yellow))
                                  .Add(make_color_rect(Am_Purple))
                                  .Add(make_color_rect(Am_Cyan))
                                  .Add(make_color_rect(Am_Black))
                                  .Add(make_color_rect(Am_White));

  Am_Style thickred(1.0, 0.0, 0.0, 7);
  Am_Style thickblack(0.0, 0.0, 0.0, 7);
  Am_Value_List line_rects = Am_Value_List()
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, Am_Black))
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, Am_Red))
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, thickred))
                                 .Add(Am_Rectangle.Create()
                                          .Set(Am_FILL_STYLE, Am_White)
                                          .Set(Am_LINE_STYLE, thickblack));
  color_rects.Start();
  line_rects.Start();
  palette = Am_Button_Panel.Create("color palette")
                .Set(Am_LEFT, 10)
                .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
                .Set(Am_LAYOUT, Am_Horizontal_Layout)
                .Set(Am_FINAL_FEEDBACK_WANTED, true)
                .Set(Am_ITEMS, color_rects)
                .Set(Am_VALUE, color_rects.Get());
  line_palette = Am_Button_Panel.Create("line palette")
                     .Set(Am_LEFT, Am_Right_Is_Right_Of_Owner)
                     .Set(Am_TOP, Am_Bottom_Is_Bottom_Of_Owner)
                     .Set(Am_LAYOUT, Am_Horizontal_Layout)
                     .Set(Am_FINAL_FEEDBACK_WANTED, true)
                     .Set(Am_ITEMS, line_rects)
                     .Set(Am_VALUE, line_rects.Get());

  Am_Screen.Add_Part(
      window =
          Am_Window.Create("window")
              .Set(Am_RIGHT_OFFSET, 10)
              .Set(Am_BOTTOM_OFFSET, 10)
              .Set(Am_LEFT, 0)
              .Set(Am_TOP, 40)
              .Set(Am_WIDTH, 640)
              .Set(Am_HEIGHT, 440)
              .Add_Part(
                  MOVER,
                  Mover =
                      Am_Rectangle.Create("Grab Me")
                          .Set(Am_LEFT, 120)
                          .Set(Am_TOP, 120)
                          .Set(Am_WIDTH, 50)
                          .Set(Am_HEIGHT, 50)
                          .Set(Am_FILL_STYLE, fetch_color.Multi_Constraint())
                          .Set(Am_FILL_STYLE,
                               Am_Animate_With(
                                   coloranimation =
                                       Am_Style_Animator
                                           .Create("fill_style_interp")
                                           .Set(Am_DURATION, Am_Time(2000))))
                          .Set(Am_LINE_STYLE, fetch_line.Multi_Constraint())
                          .Set(Am_LINE_STYLE,
                               Am_Animate_With(
                                   Am_Style_Animator.Create("line_style_interp")
                                       .Set(Am_DURATION, Am_Time(3000))))
                          .Set(Am_LINE_STYLE, Am_Black)
                          .Set(Am_VISIBLE,
                               Am_Animate_With(
                                   rectvisibleanimation =
                                       Am_Visible_Animator.Create("grow_square")
                                           .Set(Am_LEFT, 0)
                                           .Set(Am_TOP, 0)
                                           .Set(Am_WIDTH, 1)
                                           .Set(Am_HEIGHT, 1)))
                          .Add_Part(Am_Move_Grow_Interactor.Create("Mover")
                                    //.Set (Am_FEEDBACK_OBJECT, feedback)
                                    ))
              //.Add_Part (feedback)
              .Add_Part(Am_One_Shot_Interactor.Create("keyboard press")
                            .Set(Am_START_WHEN, "ANY_KEYBOARD")
                            .Get_Object(Am_COMMAND)
                            .Set(Am_DO_METHOD, key_press)
                            .Get_Owner()));

  hopper = Am_Arc.Create("Hopper")
               .Set(Am_LEFT, Am_From_Sibling(MOVER, Am_LEFT))
               .Set(Am_LEFT,
                    Am_Animate_With(Am_Stepping_Animator.Create("Hopper_Interp")
                                        .Set(Am_REPEAT_DELAY, Am_Time(1000))
                                        .Set(Am_SMALL_INCREMENT, 20)))
               .Set(Am_TOP, 20)
               .Set(Am_FILL_STYLE, Am_Green);
  window.Add_Part(hopper);

  fixed_time =
      Am_Roundtangle.Create("Fixed Time")
          .Set(Am_WIDTH, 20)
          .Set(Am_HEIGHT, 20)
          .Set(Am_TOP, Am_From_Sibling(MOVER, Am_TOP))
          .Set(Am_TOP, Am_Animate_With(Am_Animator.Create("Fixed_Time_Interp")
                                           .Set(Am_DURATION, Am_Time(4000))))
          .Set(Am_LEFT, 10)
          .Set(Am_FILL_STYLE, Am_Orange);
  window.Add_Part(fixed_time);

  wiggler =
      Am_Arc.Create("Wiggler")
          .Set(Am_WIDTH, 20)
          .Set(Am_HEIGHT, 20)
          .Set(Am_TOP, Am_From_Sibling(MOVER, Am_TOP))
          .Set(Am_TOP,
               Am_Animate_With(Am_Exaggerated_Animator.Create("Wiggler_Interp")
                                   .Set(Am_WIGGLE_AMOUNT, 4)))
          .Set(Am_LEFT, 60)
          .Set(Am_FILL_STYLE, Am_Blue)
          .Set(Am_FILL_STYLE,
               Am_Animate_With(wiggler_blink = Am_Blink_Animator.Create()
                                                   .Set(Am_VALUE_1, Am_Blue)
                                                   .Set(Am_VALUE_2, Am_Green)
                                                   .Set(Am_ACTIVE, false)))
          .Set(Am_VISIBLE, Am_Animate_With(wiggler_vis_blink =
                                               Am_Blink_Animator.Create().Set(
                                                   Am_ACTIVE, false)));
  window.Add_Part(wiggler);

  Am_Object interpolator =
      Am_Animator
          .Create("Interp_2D")
          //       .Set (Am_TIMING_FUNCTION, Am_Slow_In_Slow_Out)
          //       .Set (Am_SHARPNESS_1, 3)
          //       .Set (Am_SHARPNESS_2, 3)
          .Set(Am_INTERRUPTIBLE, false);
  Animator = Am_Rectangle.Create("Animator")
                 .Set(Am_LEFT, Am_From_Sibling(MOVER, Am_LEFT))
                 .Set(Am_TOP, Am_From_Sibling(MOVER, Am_TOP))
                 .Set(Am_LEFT, Am_Animate_With(interpolator))
                 .Set(Am_TOP, Am_Animate_With(interpolator))

                 .Set(Am_WIDTH, 50)
                 .Set(Am_HEIGHT, 50);
  window.Add_Part(Animator);

  Am_To_Top(Mover);

  fade_group = Am_Fade_Group.Create("Fade_Group")
                   .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                   .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                   .Set(Am_VALUE, 0)
                   .Set(Am_VISIBLE,
                        Am_Animate_With(Am_Visible_Animator.Create("fade").Set(
                            Am_USE_FADING, true)));
  triangle_point_list.Translate(475, 300);
  star_point_list.Translate(475, 300);
  polygon = Am_Polygon.Create("Polygon")
                .Set(Am_FILL_STYLE, Am_Red)
                .Set(Am_POINT_LIST, triangle_point_list);
  fade_group.Add_Part(palette).Add_Part(line_palette).Add_Part(polygon);
  polygon.Set(Am_POINT_LIST, Am_Animate_With(Am_Point_List_Animator.Create()));
  window.Add_Part(fade_group);

#ifdef TESTUSEPIXMAPS
  init_pixmaps();
#endif

  create_hacked_option_button();

  init_eye();

  Am_Main_Event_Loop();
  Am_Cleanup();
  return 0;
}